

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::get_big_cpu_count(void)

{
  int iVar1;
  
  try_initialize_global_cpu_info();
  try_initialize_global_cpu_info();
  iVar1 = CpuSet::num_enabled(&g_cpu_affinity_mask_big);
  if (iVar1 == 0) {
    iVar1 = g_cpucount;
  }
  return iVar1;
}

Assistant:

int get_big_cpu_count()
{
    try_initialize_global_cpu_info();
    int big_cpu_count = get_cpu_thread_affinity_mask(2).num_enabled();
    return big_cpu_count ? big_cpu_count : g_cpucount;
}